

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O3

StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>
supermap::io::
DeserializeHelper<supermap::StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>
::deserialize(istream *is)

{
  IOException *this;
  Key<2UL> obj;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  std::istream::read((char *)is,(long)local_40);
  std::istream::seekg((long)is,_S_end|_S_cur);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    return (Key<2UL>)(Key<2UL>)local_40[0]._0_2_;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"StorageValueIgnorer deserialization fail: seekg failed","");
  supermap::IOException::IOException(this,(string *)local_40);
  __cxa_throw(this,&IOException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static StorageValueIgnorer<Key, Value> deserialize(std::istream &is) {
        StorageValueIgnorer<Key, Value> svi{io::deserialize<Key>(is)};
        is.seekg(FixedDeserializedSizeRegister<Value>::exactDeserializedSize, std::ios_base::cur);
        if (is.fail()) {
            throw IOException("StorageValueIgnorer deserialization fail: seekg failed");
        }
        return svi;
    }